

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O0

bool __thiscall Nova::Arg_Data::Parse_Value(Arg_Data *this,int argc,char **argv,int *current_arg)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  int local_38;
  int local_34;
  int i_1;
  int i;
  int *current_arg_local;
  char **argv_local;
  int argc_local;
  Arg_Data *this_local;
  
  switch(this->type) {
  case OPTION:
    this->boolean_value = true;
    *current_arg = *current_arg + 1;
    this_local._7_1_ = true;
    break;
  case INTEGER:
    if (*current_arg + 1 < argc) {
      iVar1 = atoi(argv[*current_arg + 1]);
      this->integer_value = iVar1;
      *current_arg = *current_arg + 2;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case DOUBLE:
    if (*current_arg + 1 < argc) {
      dVar3 = atof(argv[*current_arg + 1]);
      this->double_value = dVar3;
      *current_arg = *current_arg + 2;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case VECTOR2:
    if (*current_arg + 2 < argc) {
      for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
        dVar3 = atof(argv[*current_arg + local_34 + 1]);
        pdVar2 = Vector<double,_2,_true>::operator[](&this->vector_2d_value,local_34);
        *pdVar2 = dVar3;
      }
      *current_arg = *current_arg + 3;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case VECTOR3:
    if (*current_arg + 3 < argc) {
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        dVar3 = atof(argv[*current_arg + local_38 + 1]);
        pdVar2 = Vector<double,_3,_true>::operator[](&this->vector_3d_value,local_38);
        *pdVar2 = dVar3;
      }
      *current_arg = *current_arg + 4;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case STRING:
    if (*current_arg + 1 < argc) {
      std::__cxx11::string::operator=((string *)&this->string_value,argv[*current_arg + 1]);
      *current_arg = *current_arg + 2;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parse_Value(int argc,char* argv[],int& current_arg)
    {
        switch(type)
        {
            case OPTION:    boolean_value=true;
                            current_arg++;
                            return true;

            case INTEGER:   if(current_arg+1<argc)
                            {
                                integer_value=atoi(argv[current_arg+1]);
                                current_arg+=2;
                                return true;
                            }
                            else return false;

            case DOUBLE:    if(current_arg+1<argc)
                            {
                                double_value=atof(argv[current_arg+1]);
                                current_arg+=2;
                                return true;
                            }
                            else return false;

            case VECTOR2:   if(current_arg+2<argc)
                            {
                                for(int i=0;i<=1;i++) vector_2d_value[i]=atof(argv[current_arg+i+1]);
                                current_arg+=3;
                                return true;
                            }
                            else return false;

            case VECTOR3:   if(current_arg+3<argc)
                            {
                                for(int i=0;i<=2;i++) vector_3d_value[i]=atof(argv[current_arg+i+1]);
                                current_arg+=4;
                                return true;
                            }
                            else return false;

            case STRING:    if(current_arg+1<argc)
                            {
                                string_value=argv[current_arg+1];
                                current_arg+=2;
                                return true;
                            }
                            else return false;

            default:        return false;
        }

        return false;
    }